

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise1d.cpp
# Opt level: O1

void __thiscall
ncnn::ConvolutionDepthWise1D::make_padding
          (ConvolutionDepthWise1D *this,Mat *bottom_blob,Mat *bottom_blob_bordered,int _kernel_w,
          Option *opt)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  float v;
  Option opt_b;
  
  iVar1 = bottom_blob->w;
  iVar6 = (_kernel_w + -1) * this->dilation_w;
  if (bottom_blob_bordered != bottom_blob) {
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = bottom_blob_bordered->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (bottom_blob_bordered->allocator == (Allocator *)0x0) {
          if (bottom_blob_bordered->data != (void *)0x0) {
            free(bottom_blob_bordered->data);
          }
        }
        else {
          (*bottom_blob_bordered->allocator->_vptr_Allocator[3])();
        }
      }
    }
    bottom_blob_bordered->cstep = 0;
    bottom_blob_bordered->data = (void *)0x0;
    bottom_blob_bordered->refcount = (int *)0x0;
    *(undefined8 *)((long)&bottom_blob_bordered->refcount + 4) = 0;
    *(undefined8 *)((long)&bottom_blob_bordered->elemsize + 4) = 0;
    bottom_blob_bordered->dims = 0;
    bottom_blob_bordered->w = 0;
    bottom_blob_bordered->h = 0;
    bottom_blob_bordered->d = 0;
    bottom_blob_bordered->c = 0;
    piVar3 = bottom_blob->refcount;
    bottom_blob_bordered->data = bottom_blob->data;
    bottom_blob_bordered->refcount = piVar3;
    bottom_blob_bordered->elemsize = bottom_blob->elemsize;
    bottom_blob_bordered->elempack = bottom_blob->elempack;
    bottom_blob_bordered->allocator = bottom_blob->allocator;
    iVar2 = bottom_blob->w;
    iVar4 = bottom_blob->h;
    iVar5 = bottom_blob->d;
    bottom_blob_bordered->dims = bottom_blob->dims;
    bottom_blob_bordered->w = iVar2;
    bottom_blob_bordered->h = iVar4;
    bottom_blob_bordered->d = iVar5;
    bottom_blob_bordered->c = bottom_blob->c;
    bottom_blob_bordered->cstep = bottom_blob->cstep;
  }
  uVar8 = this->pad_left;
  if (((int)uVar8 < 1) && (iVar2 = this->pad_right, iVar2 < 1)) {
    if (iVar2 == -0xe9 && uVar8 == 0xffffff17) {
      uVar7 = iVar6 - (iVar1 + -1) % this->stride_w;
      if ((int)uVar7 < 1) {
        return;
      }
      opt_b.lightmode = opt->lightmode;
      opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_b.num_threads = opt->num_threads;
      opt_b.workspace_allocator = opt->workspace_allocator;
      opt_b.openmp_blocktime = opt->openmp_blocktime;
      opt_b.use_winograd_convolution = opt->use_winograd_convolution;
      opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_b.use_int8_inference = opt->use_int8_inference;
      opt_b.use_vulkan_compute = opt->use_vulkan_compute;
      opt_b.use_bf16_storage = opt->use_bf16_storage;
      opt_b.use_fp16_packed = opt->use_fp16_packed;
      opt_b.use_fp16_storage = opt->use_fp16_storage;
      opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_b.use_int8_packed = opt->use_int8_packed;
      opt_b.use_int8_storage = opt->use_int8_storage;
      opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_b.use_packing_layout = opt->use_packing_layout;
      opt_b.use_shader_pack8 = opt->use_shader_pack8;
      opt_b.use_subgroup_basic = opt->use_subgroup_basic;
      opt_b.use_subgroup_vote = opt->use_subgroup_vote;
      opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_b.use_image_storage = opt->use_image_storage;
      opt_b.use_tensor_storage = opt->use_tensor_storage;
      opt_b.use_reserved_0 = opt->use_reserved_0;
      opt_b.flush_denormals = opt->flush_denormals;
      opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_b.use_shader_local_memory = opt->use_shader_local_memory;
      opt_b.use_cooperative_matrix = opt->use_cooperative_matrix;
      opt_b.use_winograd23_convolution = opt->use_winograd23_convolution;
      opt_b.use_winograd43_convolution = opt->use_winograd43_convolution;
      opt_b.use_winograd63_convolution = opt->use_winograd63_convolution;
      opt_b.use_reserved_6 = opt->use_reserved_6;
      opt_b.use_reserved_7 = opt->use_reserved_7;
      opt_b.use_reserved_8 = opt->use_reserved_8;
      opt_b.use_reserved_9 = opt->use_reserved_9;
      opt_b.use_reserved_10 = opt->use_reserved_10;
      opt_b.use_reserved_11 = opt->use_reserved_11;
      opt_b.blob_allocator = opt->workspace_allocator;
      uVar8 = uVar7 >> 1;
      uVar7 = uVar7 - uVar8;
      v = this->pad_value;
    }
    else {
      if (iVar2 != -0xea || uVar8 != 0xffffff16) {
        return;
      }
      uVar8 = iVar6 - (iVar1 + -1) % this->stride_w;
      if ((int)uVar8 < 1) {
        return;
      }
      opt_b.lightmode = opt->lightmode;
      opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_b.num_threads = opt->num_threads;
      opt_b.workspace_allocator = opt->workspace_allocator;
      opt_b.openmp_blocktime = opt->openmp_blocktime;
      opt_b.use_winograd_convolution = opt->use_winograd_convolution;
      opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_b.use_int8_inference = opt->use_int8_inference;
      opt_b.use_vulkan_compute = opt->use_vulkan_compute;
      opt_b.use_bf16_storage = opt->use_bf16_storage;
      opt_b.use_fp16_packed = opt->use_fp16_packed;
      opt_b.use_fp16_storage = opt->use_fp16_storage;
      opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_b.use_int8_packed = opt->use_int8_packed;
      opt_b.use_int8_storage = opt->use_int8_storage;
      opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_b.use_packing_layout = opt->use_packing_layout;
      opt_b.use_shader_pack8 = opt->use_shader_pack8;
      opt_b.use_subgroup_basic = opt->use_subgroup_basic;
      opt_b.use_subgroup_vote = opt->use_subgroup_vote;
      opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_b.use_image_storage = opt->use_image_storage;
      opt_b.use_tensor_storage = opt->use_tensor_storage;
      opt_b.use_reserved_0 = opt->use_reserved_0;
      opt_b.flush_denormals = opt->flush_denormals;
      opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_b.use_shader_local_memory = opt->use_shader_local_memory;
      opt_b.use_cooperative_matrix = opt->use_cooperative_matrix;
      opt_b.use_winograd23_convolution = opt->use_winograd23_convolution;
      opt_b.use_winograd43_convolution = opt->use_winograd43_convolution;
      opt_b.use_winograd63_convolution = opt->use_winograd63_convolution;
      opt_b.use_reserved_6 = opt->use_reserved_6;
      opt_b.use_reserved_7 = opt->use_reserved_7;
      opt_b.use_reserved_8 = opt->use_reserved_8;
      opt_b.use_reserved_9 = opt->use_reserved_9;
      opt_b.use_reserved_10 = opt->use_reserved_10;
      opt_b.use_reserved_11 = opt->use_reserved_11;
      opt_b.blob_allocator = opt->workspace_allocator;
      uVar7 = uVar8 >> 1;
      uVar8 = uVar8 - uVar7;
      v = this->pad_value;
    }
  }
  else {
    opt_b.lightmode = opt->lightmode;
    opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_b.num_threads = opt->num_threads;
    opt_b.workspace_allocator = opt->workspace_allocator;
    opt_b.openmp_blocktime = opt->openmp_blocktime;
    opt_b.use_winograd_convolution = opt->use_winograd_convolution;
    opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_b.use_int8_inference = opt->use_int8_inference;
    opt_b.use_vulkan_compute = opt->use_vulkan_compute;
    opt_b.use_bf16_storage = opt->use_bf16_storage;
    opt_b.use_fp16_packed = opt->use_fp16_packed;
    opt_b.use_fp16_storage = opt->use_fp16_storage;
    opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_b.use_int8_packed = opt->use_int8_packed;
    opt_b.use_int8_storage = opt->use_int8_storage;
    opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_b.use_packing_layout = opt->use_packing_layout;
    opt_b.use_shader_pack8 = opt->use_shader_pack8;
    opt_b.use_subgroup_basic = opt->use_subgroup_basic;
    opt_b.use_subgroup_vote = opt->use_subgroup_vote;
    opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_b.use_image_storage = opt->use_image_storage;
    opt_b.use_tensor_storage = opt->use_tensor_storage;
    opt_b.use_reserved_0 = opt->use_reserved_0;
    opt_b.flush_denormals = opt->flush_denormals;
    opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_b.use_shader_local_memory = opt->use_shader_local_memory;
    opt_b.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_b.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_b.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_b.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_b.use_reserved_6 = opt->use_reserved_6;
    opt_b.use_reserved_7 = opt->use_reserved_7;
    opt_b.use_reserved_8 = opt->use_reserved_8;
    opt_b.use_reserved_9 = opt->use_reserved_9;
    opt_b.use_reserved_10 = opt->use_reserved_10;
    opt_b.use_reserved_11 = opt->use_reserved_11;
    opt_b.blob_allocator = opt->workspace_allocator;
    uVar7 = this->pad_right;
    v = this->pad_value;
  }
  copy_make_border(bottom_blob,bottom_blob_bordered,0,0,uVar8,uVar7,0,v,&opt_b);
  return;
}

Assistant:

void ConvolutionDepthWise1D::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, int _kernel_w, const Option& opt) const
{
    int w = bottom_blob.w;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;

    bottom_blob_bordered = bottom_blob;
    if (pad_left > 0 || pad_right > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_left == -233 && pad_right == -233)
    {
        // tensorflow padding=SAME or onnx padding=SAME_UPPER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        if (wpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_left == -234 && pad_right == -234)
    {
        // onnx padding=SAME_LOWER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        if (wpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}